

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNegativePartialUpdateTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_0::NegativePartialUpdateTest::expectError
          (NegativePartialUpdateTest *this,EGLenum expected)

{
  qpTestResult qVar1;
  Library *pLVar2;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  Enum<int,_2UL> EVar4;
  Enum<int,_2UL> local_1d8;
  GetNameFunc local_1c8;
  int local_1c0;
  Enum<int,_2UL> local_1b8 [2];
  MessageBuilder local_198;
  EGLenum local_18;
  EGLenum local_14;
  EGLenum err;
  EGLenum expected_local;
  NegativePartialUpdateTest *this_local;
  
  local_14 = expected;
  _err = this;
  pLVar2 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_18 = (*pLVar2->_vptr_Library[0x1f])();
  if (local_18 != local_14) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_198,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [20])"// ERROR expected: ");
    EVar4 = eglu::getErrorStr(local_14);
    local_1c8 = EVar4.m_getName;
    local_1c0 = EVar4.m_value;
    local_1b8[0].m_getName = local_1c8;
    local_1b8[0].m_value = local_1c0;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1b8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [8])", Got: ");
    EVar4 = eglu::getErrorStr(local_18);
    local_1d8.m_getName = EVar4.m_getName;
    local_1d8.m_value = EVar4.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1d8);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_198);
    qVar1 = tcu::TestContext::getTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if (qVar1 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Got invalid error");
    }
  }
  return;
}

Assistant:

void NegativePartialUpdateTest::expectError (EGLenum expected)
{
	const EGLenum err = m_eglTestCtx.getLibrary().getError();

	if (err != expected)
	{
		m_testCtx.getLog() << TestLog::Message << "// ERROR expected: " << eglu::getErrorStr(expected) << ", Got: " << eglu::getErrorStr(err) << TestLog::EndMessage;
		if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid error");
	}
}